

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

void __thiscall
miyuki::serialize::InputArchive::_load<std::shared_ptr<Bar>>
          (InputArchive *this,
          vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *vec)

{
  ulong uVar1;
  json *pjVar2;
  size_type sVar3;
  const_reference ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  reference ptr;
  string local_78;
  allocator<char> local_41;
  string local_40 [32];
  ulong local_20;
  size_t i;
  vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *vec_local;
  InputArchive *this_local;
  
  local_20 = 0;
  i = (size_t)vec;
  vec_local = (vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *)this;
  while( true ) {
    uVar1 = local_20;
    pjVar2 = _top_abi_cxx11_(this);
    sVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::size(pjVar2);
    if (sVar3 <= uVar1) break;
    pjVar2 = _top_abi_cxx11_(this);
    ref = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::at(pjVar2,local_20);
    _makeNode(this,ref);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"/",&local_41);
    std::__cxx11::to_string(&local_78,local_20);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::append(local_40);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,__args);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    std::vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>::emplace_back<>
              ((vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *)i);
    ptr = std::vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>::back
                    ((vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *)i);
    _load<Bar>(this,ptr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
    _popNode(this);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void _load(std::vector<T> &vec) {
            for (size_t i = 0; i < _top().size(); i++) {
                _makeNode(_top().at(i));
                locator.emplace_back(std::string("/").append(std::to_string(i)));
                vec.emplace_back();
                _load(vec.back());
                locator.pop_back();
                _popNode();
            }
        }